

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsGetValueType(JsValueRef value,JsValueType *type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  RecyclableObject *this;
  TypeId typeId;
  DebugCheckNoException __debugCheckNoException;
  JsValueType *type_local;
  JsValueRef value_local;
  TypeId local_18;
  TypeId typeId_1;
  
  if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorInvalidArgument;
  }
  else if (type == (JsValueType *)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else {
    __debugCheckNoException = (DebugCheckNoException)type;
    DebugCheckNoException::DebugCheckNoException((DebugCheckNoException *)&stack0xffffffffffffffc0);
    if (value == (JsValueRef)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                         ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    bVar2 = Js::TaggedInt::Is(value);
    if (bVar2) {
      local_18 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = Js::JavascriptNumber::Is_NoTaggedIntCheck(value);
      if (bVar2) {
        local_18 = TypeIds_Number;
      }
      else {
        this = Js::UnsafeVarTo<Js::RecyclableObject>(value);
        if (this == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
        local_18 = Js::RecyclableObject::GetTypeId(this);
        if ((0x57 < (int)local_18) && (BVar3 = Js::RecyclableObject::IsExternal(this), BVar3 == 0))
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Language/JavascriptOperators.inl"
                             ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                             "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    switch(local_18) {
    case TypeIds_Undefined:
      *(undefined4 *)__debugCheckNoException = 0;
      break;
    case TypeIds_Null:
      *(undefined4 *)__debugCheckNoException = 1;
      break;
    case TypeIds_Boolean:
      *(undefined4 *)__debugCheckNoException = 4;
      break;
    case TypeIds_FirstNumberType:
    case TypeIds_Number:
    case TypeIds_Int64Number:
    case TypeIds_LastNumberType:
      *(undefined4 *)__debugCheckNoException = 2;
      break;
    case TypeIds_String:
      *(undefined4 *)__debugCheckNoException = 3;
      break;
    case TypeIds_Symbol:
      *(undefined4 *)__debugCheckNoException = 9;
      break;
    default:
      BVar3 = Js::TypedArrayBase::Is(local_18);
      if (BVar3 == 0) {
        *(undefined4 *)__debugCheckNoException = 5;
      }
      else {
        *(undefined4 *)__debugCheckNoException = 0xb;
      }
      break;
    case TypeIds_Function:
      *(undefined4 *)__debugCheckNoException = 6;
      break;
    case TypeIds_Array:
    case TypeIds_NativeIntArray:
    case TypeIds_CopyOnAccessNativeIntArray:
    case TypeIds_ArrayLast:
    case TypeIds_ArrayLastWithES5:
      *(undefined4 *)__debugCheckNoException = 8;
      break;
    case TypeIds_Error:
      *(undefined4 *)__debugCheckNoException = 7;
      break;
    case TypeIds_ArrayBuffer:
      *(undefined4 *)__debugCheckNoException = 10;
      break;
    case TypeIds_DataView:
      *(undefined4 *)__debugCheckNoException = 0xc;
    }
    typeId._0_1_ = TypeIds_Undefined;
    DebugCheckNoException::~DebugCheckNoException((DebugCheckNoException *)&stack0xffffffffffffffc0)
    ;
    value_local._4_4_ = JsNoError;
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsGetValueType(_In_ JsValueRef value, _Out_ JsValueType *type)
{
    VALIDATE_JSREF(value);
    PARAM_NOT_NULL(type);

    BEGIN_JSRT_NO_EXCEPTION
    {
        Js::TypeId typeId = Js::JavascriptOperators::GetTypeId(value);
        switch (typeId)
        {
        case Js::TypeIds_Undefined:
            *type = JsUndefined;
            break;
        case Js::TypeIds_Null:
            *type = JsNull;
            break;
        case Js::TypeIds_Boolean:
            *type = JsBoolean;
            break;
        case Js::TypeIds_Integer:
        case Js::TypeIds_Number:
        case Js::TypeIds_Int64Number:
        case Js::TypeIds_UInt64Number:
            *type = JsNumber;
            break;
        case Js::TypeIds_String:
            *type = JsString;
            break;
        case Js::TypeIds_Function:
            *type = JsFunction;
            break;
        case Js::TypeIds_Error:
            *type = JsError;
            break;
        case Js::TypeIds_Array:
        case Js::TypeIds_NativeIntArray:
#if ENABLE_COPYONACCESS_ARRAY
        case Js::TypeIds_CopyOnAccessNativeIntArray:
#endif
        case Js::TypeIds_NativeFloatArray:
        case Js::TypeIds_ES5Array:
            *type = JsArray;
            break;
        case Js::TypeIds_Symbol:
            *type = JsSymbol;
            break;
        case Js::TypeIds_ArrayBuffer:
            *type = JsArrayBuffer;
            break;
        case Js::TypeIds_DataView:
            *type = JsDataView;
            break;
        default:
            if (Js::TypedArrayBase::Is(typeId))
            {
                *type = JsTypedArray;
            }
            else
            {
                *type = JsObject;
            }
            break;
        }
    }